

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode SUNMatSpace_Sparse(SUNMatrix A,long *lenrw,long *leniw)

{
  SUNContext sunctx_local_scope_;
  long *leniw_local;
  long *lenrw_local;
  SUNMatrix A_local;
  
  *lenrw = *(long *)((long)A->content + 0x10);
  *leniw = *(long *)((long)A->content + 0x18) + 10 + *(long *)((long)A->content + 0x10);
  return 0;
}

Assistant:

SUNErrCode SUNMatSpace_Sparse(SUNMatrix A, long int* lenrw, long int* leniw)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(lenrw, SUN_ERR_ARG_CORRUPT);
  SUNAssert(leniw, SUN_ERR_ARG_CORRUPT);
  *lenrw = SM_NNZ_S(A);
  *leniw = 10 + SM_NP_S(A) + SM_NNZ_S(A);
  return SUN_SUCCESS;
}